

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

xmlTextWriterPtr xmlNewTextWriter(xmlOutputBufferPtr out)

{
  xmlTextWriterPtr pxVar1;
  xmlListPtr pxVar2;
  xmlChar *pxVar3;
  xmlDocPtr pxVar4;
  
  pxVar1 = (xmlTextWriterPtr)(*xmlMalloc)(0x50);
  if (pxVar1 == (xmlTextWriterPtr)0x0) {
LAB_001d3220:
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x19,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s","xmlNewTextWriter : out of memory!\n");
  }
  else {
    *(undefined8 *)&pxVar1->no_doc_free = 0;
    pxVar1->doc = (xmlDocPtr)0x0;
    *(undefined8 *)&pxVar1->qchar = 0;
    pxVar1->ctxt = (xmlParserCtxtPtr)0x0;
    *(undefined8 *)&pxVar1->doindent = 0;
    pxVar1->ichar = (xmlChar *)0x0;
    pxVar1->nsstack = (xmlListPtr)0x0;
    pxVar1->level = 0;
    pxVar1->indent = 0;
    pxVar1->out = (xmlOutputBufferPtr)0x0;
    pxVar1->nodes = (xmlListPtr)0x0;
    pxVar2 = xmlListCreate(xmlFreeTextWriterStackEntry,xmlCmpTextWriterStackEntry);
    pxVar1->nodes = pxVar2;
    if (pxVar2 == (xmlListPtr)0x0) {
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x19,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                      (char *)0x0,0,0,"%s","xmlNewTextWriter : out of memory!\n");
    }
    else {
      pxVar2 = xmlListCreate(xmlFreeTextWriterNsStackEntry,xmlCmpTextWriterNsStackEntry);
      pxVar1->nsstack = pxVar2;
      if (pxVar2 != (xmlListPtr)0x0) {
        pxVar1->out = out;
        pxVar3 = xmlStrdup(" ");
        pxVar1->ichar = pxVar3;
        pxVar1->qchar = '\"';
        if (pxVar3 != (xmlChar *)0x0) {
          pxVar4 = xmlNewDoc((xmlChar *)0x0);
          pxVar1->doc = pxVar4;
          pxVar1->no_doc_free = 0;
          return pxVar1;
        }
        xmlListDelete(pxVar1->nodes);
        xmlListDelete(pxVar1->nsstack);
        (*xmlFree)(pxVar1);
        goto LAB_001d3220;
      }
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x19,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                      (char *)0x0,0,0,"%s","xmlNewTextWriter : out of memory!\n");
      xmlListDelete(pxVar1->nodes);
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlTextWriterPtr)0x0;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriter(xmlOutputBufferPtr out)
{
    xmlTextWriterPtr ret;

    ret = (xmlTextWriterPtr) xmlMalloc(sizeof(xmlTextWriter));
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        return NULL;
    }
    memset(ret, 0, sizeof(xmlTextWriter));

    ret->nodes = xmlListCreate(xmlFreeTextWriterStackEntry,
                               xmlCmpTextWriterStackEntry);
    if (ret->nodes == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        xmlFree(ret);
        return NULL;
    }

    ret->nsstack = xmlListCreate(xmlFreeTextWriterNsStackEntry,
                                 xmlCmpTextWriterNsStackEntry);
    if (ret->nsstack == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        xmlListDelete(ret->nodes);
        xmlFree(ret);
        return NULL;
    }

    ret->out = out;
    ret->ichar = xmlStrdup(BAD_CAST " ");
    ret->qchar = '"';

    if (!ret->ichar) {
        xmlListDelete(ret->nodes);
        xmlListDelete(ret->nsstack);
        xmlFree(ret);
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriter : out of memory!\n");
        return NULL;
    }

    ret->doc = xmlNewDoc(NULL);

    ret->no_doc_free = 0;

    return ret;
}